

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

void __thiscall PyreNet::Perceptron::mutate_gaussian(Perceptron *this,double mean,double std)

{
  bool bVar1;
  RandomGenerator *this_00;
  reference pdVar2;
  double dVar3;
  double *weight;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  RandomGenerator *randomGenerator;
  double std_local;
  double mean_local;
  Perceptron *this_local;
  
  this_00 = RandomGenerator::getInstance();
  __end1 = ::std::vector<double,_std::allocator<double>_>::begin(&this->weights);
  weight = (double *)::std::vector<double,_std::allocator<double>_>::end(&this->weights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&weight);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar3 = RandomGenerator::generate_gaussian(this_00,mean,std);
    *pdVar2 = dVar3 + *pdVar2;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Perceptron::mutate_gaussian(const double mean, const double std) {
        RandomGenerator *randomGenerator = RandomGenerator::getInstance();
        for (double &weight : this->weights) {
            weight += randomGenerator->generate_gaussian(mean, std);
        }
    }